

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double __x;
  ServerSocket server;
  int client;
  ThreadPool<int,_8UL> threadPool;
  allocator<char> local_159;
  ServerSocket local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  ThreadPool<int,_8UL> local_100;
  
  ServerSocket::ServerSocket(&local_158,0x1f90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"Listening on port: ",&local_159);
  std::__cxx11::to_string(&local_120,0x1f90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 &local_140,&local_120);
  ServerSocket::log(&local_158,__x);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  ThreadPool<int,8ul>::ThreadPool<void(int,ServerSocket&)>
            ((ThreadPool<int,8ul> *)&local_100,handleConnection,&local_158);
  do {
    do {
      local_140._M_dataplus._M_p._0_4_ = ServerSocket::acceptConnection(&local_158);
    } while ((int)local_140._M_dataplus._M_p < 0);
    ThreadPool<int,_8UL>::addTask(&local_100,(int *)&local_140);
  } while( true );
}

Assistant:

int main(int argc, char const *argv[])
{
	ServerSocket server(PORT);
    server.log(string("Listening on port: ") + to_string(PORT));

    ThreadPool<int, THREADPOOL_SIZE> threadPool(handleConnection, server);

    while (true)
    {
		int client = server.acceptConnection();
        if (client < 0) continue;

        threadPool.addTask(client);
    }
    
    return 0;
}